

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

void __thiscall
Imf_3_3::Compressor::Compressor
          (Compressor *this,Header *hdr,exr_compression_t compression_type,size_t maxScanLineSize,
          int numScanLines)

{
  int iVar1;
  exr_storage_t eVar2;
  exr_result_t eVar3;
  undefined8 uVar4;
  ArgExc *this_00;
  ulong in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  bool in_stack_0000003f;
  Context *in_stack_00000040;
  int in_stack_0000006c;
  Context *in_stack_00000070;
  exr_compression_t hdrcomp;
  Header *in_stack_00000480;
  int in_stack_0000048c;
  Context *in_stack_00000490;
  exr_compression_t *in_stack_fffffffffffffe98;
  Header *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined8 *local_f0;
  undefined8 *local_c0;
  int local_b8;
  ContextInitializer local_a0;
  undefined4 local_24;
  ulong local_20;
  int local_14;
  undefined8 local_10;
  
  *in_RDI = &PTR__Compressor_004c6658;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  memset(&local_a0,0,0x78);
  ContextInitializer::ContextInitializer(&local_a0);
  Context::Context((Context *)(in_RDI + 1),"<compression>",&local_a0);
  in_RDI[3] = local_10;
  in_RDI[4] = local_20;
  *(undefined4 *)(in_RDI + 5) = local_24;
  *(int *)((long)in_RDI + 0x2c) = local_14;
  in_RDI[7] = 0x1f8;
  in_RDI[8] = 0;
  *(undefined2 *)(in_RDI + 9) = 0;
  *(undefined2 *)((long)in_RDI + 0x4a) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  in_RDI[10] = 0;
  memset(in_RDI + 0xb,0,0x40);
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  local_c0 = in_RDI + 0x28;
  memset(local_c0,0,0xf0);
  do {
    local_c0 = local_c0 + 6;
  } while (local_c0 != in_RDI + 0x46);
  in_RDI[0x46] = 0x200;
  in_RDI[0x47] = 0;
  *(undefined2 *)(in_RDI + 0x48) = 0;
  *(undefined2 *)((long)in_RDI + 0x242) = 0;
  *(undefined4 *)((long)in_RDI + 0x244) = 0;
  in_RDI[0x49] = 0;
  memset(in_RDI + 0x4a,0,0x40);
  in_RDI[0x52] = 0;
  in_RDI[0x53] = 0;
  in_RDI[0x54] = 0;
  in_RDI[0x55] = 0;
  in_RDI[0x56] = 0;
  in_RDI[0x57] = 0;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  in_RDI[0x5f] = 0;
  in_RDI[0x60] = 0;
  in_RDI[0x61] = 0;
  in_RDI[0x62] = 0;
  in_RDI[99] = 0;
  in_RDI[100] = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x66] = 0;
  in_RDI[0x67] = 0;
  local_f0 = in_RDI + 0x68;
  memset(local_f0,0,0xf0);
  do {
    local_f0 = local_f0 + 6;
  } while (local_f0 != in_RDI + 0x86);
  *(undefined1 *)(in_RDI + 0x86) = 0;
  *(undefined1 *)((long)in_RDI + 0x431) = 0;
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffea0);
  in_RDI[0x88] = 0;
  in_RDI[0x89] = 0;
  *(undefined4 *)(in_RDI + 0x8a) = 0;
  *(undefined4 *)((long)in_RDI + 0x454) = 0;
  iVar1 = std::numeric_limits<int>::max();
  if (local_20 <= (ulong)(long)iVar1) {
    Context::setLongNameSupport(in_stack_00000040,in_stack_0000003f);
    Context::addHeader(in_stack_00000490,in_stack_0000048c,in_stack_00000480);
    eVar2 = Context::storage(in_stack_00000070,in_stack_0000006c);
    *(exr_storage_t *)(in_RDI + 6) = eVar2;
    Context::operator_cast_to__priv_exr_context_t_((Context *)0x124f09);
    Header::zipCompressionLevel(in_stack_fffffffffffffea0);
    exr_set_zip_compression_level
              ((exr_context_t)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),(int)in_stack_fffffffffffffea0);
    Context::operator_cast_to__priv_exr_context_t_((Context *)0x124f44);
    Header::dwaCompressionLevel(in_stack_fffffffffffffea0);
    exr_set_dwa_compression_level
              ((exr_context_t)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0));
    Context::operator_cast_to__priv_exr_context_t_((Context *)0x124f83);
    eVar3 = exr_get_compression((exr_const_context_t)
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                                in_stack_fffffffffffffe98);
    if (eVar3 != 0) {
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98)
      ;
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    if ((local_b8 != local_14) && (local_14 != 10)) {
      Context::operator_cast_to__priv_exr_context_t_((Context *)0x12503b);
      eVar3 = exr_set_compression((exr_context_t)CONCAT44(eVar3,in_stack_fffffffffffffeb8),
                                  (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                  (exr_compression_t)in_stack_fffffffffffffeb0);
      if (eVar3 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc(this_00,(char *)in_stack_fffffffffffffe98);
        __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x48);
  Iex_3_3::OverflowExc::OverflowExc
            ((OverflowExc *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  __cxa_throw(uVar4,&Iex_3_3::OverflowExc::typeinfo,Iex_3_3::OverflowExc::~OverflowExc);
}

Assistant:

Compressor::Compressor (
    const Header& hdr,
    exr_compression_t compression_type,
    size_t maxScanLineSize,
    int numScanLines)
    : _ctxt ("<compression>",
             ContextInitializer(),
             Context::temp_mode_t
             {})
    , _header (hdr)
    , _maxScanLineSize (maxScanLineSize)
    , _numScanLines (numScanLines)
    , _comp_type (compression_type)
{
    if (maxScanLineSize > std::numeric_limits<int>::max ())
    {
        throw IEX_NAMESPACE::OverflowExc (
            "ScanLine size too large for RleCompressor");
    }
    _ctxt.setLongNameSupport (true);
    _ctxt.addHeader (0, hdr);

    _store_type = _ctxt.storage (0);

    exr_set_zip_compression_level (_ctxt, 0, hdr.zipCompressionLevel ());
    exr_set_dwa_compression_level (_ctxt, 0, hdr.dwaCompressionLevel ());

    exr_compression_t hdrcomp;
    if (EXR_ERR_SUCCESS != exr_get_compression (_ctxt, 0, &hdrcomp))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize compression type");

    if (hdrcomp != compression_type &&
        compression_type != EXR_COMPRESSION_LAST_TYPE)
    {
        // no idea why this would fail, but also do need to apply it
        // prior to the chunk initialization to have lines per chunk, etc.
        // be correct
        if (EXR_ERR_SUCCESS != exr_set_compression (_ctxt, 0, compression_type))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize compression type");
    }
 }